

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cpp
# Opt level: O2

void __thiscall ResolverThread::stop(ResolverThread *this)

{
  allocator local_7a;
  allocator local_79;
  string local_78;
  string local_58;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  LOCK();
  (this->keep_running)._M_base._M_i = false;
  UNLOCK();
  std::__cxx11::string::string((string *)&local_58,"",&local_79);
  std::__cxx11::string::string((string *)&local_78,"",&local_7a);
  local_28 = 0;
  uStack_20 = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  resolve(this,&local_58,&local_78,(EventLoop *)0x0,(ResolverHandler *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void ResolverThread::stop() {
    keep_running = false;
    resolve("", "", nullptr, nullptr);
}